

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_mgr.cxx
# Opt level: O2

stat_elem * __thiscall nuraft::stat_mgr::create_stat(stat_mgr *this,Type type,string *stat_name)

{
  int iVar1;
  undefined4 in_register_00000034;
  allocator local_29;
  string local_28;
  
  if (create_stat(nuraft::stat_elem::Type,std::__cxx11::string_const&)::dummy_elem == '\0') {
    iVar1 = __cxa_guard_acquire(&create_stat(nuraft::stat_elem::Type,std::__cxx11::string_const&)::
                                 dummy_elem,CONCAT44(in_register_00000034,type));
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_28,"dummy",&local_29);
      stat_elem::stat_elem(&create_stat::dummy_elem,COUNTER,&local_28);
      std::__cxx11::string::~string((string *)&local_28);
      __cxa_atexit(stat_elem::~stat_elem,&create_stat::dummy_elem,&__dso_handle);
      __cxa_guard_release(&create_stat(nuraft::stat_elem::Type,std::__cxx11::string_const&)::
                           dummy_elem);
    }
  }
  return &create_stat::dummy_elem;
}

Assistant:

stat_elem* stat_mgr::create_stat(stat_elem::Type type, const std::string& stat_name) {
#ifndef ENABLE_RAFT_STATS
    static stat_elem dummy_elem(stat_elem::COUNTER, "dummy");
    (void)type;
    (void)stat_name;
    return &dummy_elem;
#endif

    stat_elem* elem = new stat_elem(type, stat_name);

    std::unique_lock<std::mutex> l(stat_map_lock_);
    auto entry = stat_map_.find(stat_name);
    if (entry != stat_map_.end()) {
        // Alraedy exist.
        delete elem;
        return entry->second;
    }
    stat_map_.insert( std::make_pair(stat_name, elem) );
    return elem;
}